

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first.c
# Opt level: O3

int select_wrapper(int nfds,fd_set *rd,fd_set *wr,fd_set *exc,timeval *tv)

{
  int iVar1;
  int *piVar2;
  
  if (nfds < 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    return -1;
  }
  iVar1 = select(nfds,(fd_set *)rd,(fd_set *)wr,(fd_set *)exc,(timeval *)tv);
  return iVar1;
}

Assistant:

int select_wrapper(int nfds, fd_set *rd, fd_set *wr, fd_set *exc,
                   struct timeval *tv)
{
  if(nfds < 0) {
    SET_SOCKERRNO(EINVAL);
    return -1;
  }
#ifdef USE_WINSOCK
  /*
   * Winsock select() requires that at least one of the three fd_set
   * pointers is not NULL and points to a non-empty fdset. IOW Winsock
   * select() can not be used to sleep without a single fd_set.
   */
  if(!nfds) {
    Sleep((1000*tv->tv_sec) + (DWORD)(((double)tv->tv_usec)/1000.0));
    return 0;
  }
#endif
  return select(nfds, rd, wr, exc, tv);
}